

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_uint32 ma_calculate_buffer_size_in_frames_from_descriptor
                    (ma_device_descriptor *pDescriptor,ma_uint32 nativeSampleRate,
                    ma_performance_profile performanceProfile)

{
  ma_uint32 local_1c;
  ma_performance_profile performanceProfile_local;
  ma_uint32 nativeSampleRate_local;
  ma_device_descriptor *pDescriptor_local;
  
  if (pDescriptor == (ma_device_descriptor *)0x0) {
    pDescriptor_local._4_4_ = 0;
  }
  else {
    local_1c = nativeSampleRate;
    if (nativeSampleRate == 0) {
      local_1c = pDescriptor->sampleRate;
    }
    if (local_1c == 0) {
      local_1c = 48000;
    }
    if (local_1c == 0) {
      __assert_fail("nativeSampleRate != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/gulrak[P]relive-client/thirdparty/mackron/miniaudio.h"
                    ,0x83f1,
                    "ma_uint32 ma_calculate_buffer_size_in_frames_from_descriptor(const ma_device_descriptor *, ma_uint32, ma_performance_profile)"
                   );
    }
    if (pDescriptor->periodSizeInFrames == 0) {
      if (pDescriptor->periodSizeInMilliseconds == 0) {
        if (performanceProfile == ma_performance_profile_low_latency) {
          pDescriptor_local._4_4_ =
               ma_calculate_buffer_size_in_frames_from_milliseconds(10,local_1c);
        }
        else {
          pDescriptor_local._4_4_ =
               ma_calculate_buffer_size_in_frames_from_milliseconds(100,local_1c);
        }
      }
      else {
        pDescriptor_local._4_4_ =
             ma_calculate_buffer_size_in_frames_from_milliseconds
                       (pDescriptor->periodSizeInMilliseconds,local_1c);
      }
    }
    else {
      pDescriptor_local._4_4_ = pDescriptor->periodSizeInFrames;
    }
  }
  return pDescriptor_local._4_4_;
}

Assistant:

MA_API ma_uint32 ma_calculate_buffer_size_in_frames_from_descriptor(const ma_device_descriptor* pDescriptor, ma_uint32 nativeSampleRate, ma_performance_profile performanceProfile)
{
    if (pDescriptor == NULL) {
        return 0;
    }

    /*
    We must have a non-0 native sample rate, but some backends don't allow retrieval of this at the
    time when the size of the buffer needs to be determined. In this case we need to just take a best
    guess and move on. We'll try using the sample rate in pDescriptor first. If that's not set we'll
    just fall back to MA_DEFAULT_SAMPLE_RATE.
    */
    if (nativeSampleRate == 0) {
        nativeSampleRate = pDescriptor->sampleRate;
    }
    if (nativeSampleRate == 0) {
        nativeSampleRate = MA_DEFAULT_SAMPLE_RATE;
    }

    MA_ASSERT(nativeSampleRate != 0);

    if (pDescriptor->periodSizeInFrames == 0) {
        if (pDescriptor->periodSizeInMilliseconds == 0) {
            if (performanceProfile == ma_performance_profile_low_latency) {
                return ma_calculate_buffer_size_in_frames_from_milliseconds(MA_DEFAULT_PERIOD_SIZE_IN_MILLISECONDS_LOW_LATENCY, nativeSampleRate);
            } else {
                return ma_calculate_buffer_size_in_frames_from_milliseconds(MA_DEFAULT_PERIOD_SIZE_IN_MILLISECONDS_CONSERVATIVE, nativeSampleRate);
            }
        } else {
            return ma_calculate_buffer_size_in_frames_from_milliseconds(pDescriptor->periodSizeInMilliseconds, nativeSampleRate);
        }
    } else {
        return pDescriptor->periodSizeInFrames;
    }
}